

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O3

void redraw_GL(SWindowData *window_data,void *pixels)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 local_68;
  undefined8 local_60;
  float local_58;
  float local_54;
  undefined8 local_50;
  float local_48;
  float local_44;
  undefined8 local_40;
  float local_38;
  float fStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  puVar3 = (undefined8 *)window_data->specific;
  local_60 = 0;
  local_50 = 0x3f800000;
  local_40 = 0x3f80000000000000;
  uVar1._0_4_ = window_data->dst_offset_x;
  uVar1._4_4_ = window_data->dst_offset_y;
  auVar4._0_8_ = uVar1 & 0xffffffff;
  auVar4._8_4_ = uVar1._4_4_;
  auVar4._12_4_ = 0;
  local_48 = (float)(SUB168(auVar4 | _DAT_00105a80,0) - (double)DAT_00105a80);
  local_54 = (float)(SUB168(auVar4 | _DAT_00105a80,8) - DAT_00105a80._8_8_);
  local_68 = CONCAT44(local_54,local_48);
  uVar2._0_4_ = window_data->dst_width;
  uVar2._4_4_ = window_data->dst_height;
  auVar5._0_8_ = uVar2 & 0xffffffff;
  auVar5._8_4_ = uVar2._4_4_;
  auVar5._12_4_ = 0;
  local_58 = (float)(SUB168(auVar5 | _DAT_00105a80,0) - (double)DAT_00105a80) + local_48;
  local_44 = (float)(SUB168(auVar5 | _DAT_00105a80,8) - DAT_00105a80._8_8_) + local_54;
  uStack_30 = 0x3f800000;
  uStack_2c = 0x3f800000;
  local_38 = local_58;
  fStack_34 = local_44;
  glClear(0x4000);
  glTexImage2D(0xde1,0,0x1907,window_data->buffer_width,window_data->buffer_height,0,0x80e1,0x1401,
               pixels);
  glVertexPointer(2,0x1406,0x10,&local_68);
  glTexCoordPointer(2,0x1406,0x10,&local_60);
  glDrawArrays(5,0,4);
  glXSwapBuffers(puVar3[1],*puVar3);
  return;
}

Assistant:

void 
redraw_GL(SWindowData *window_data, const void *pixels) {
#if defined(_WIN32) || defined(WIN32)

    SWindowData_Win *window_data_ex = (SWindowData_Win *) window_data->specific;
    GLenum format = BGRA;

#elif defined(linux)

    SWindowData_X11 *window_data_ex = (SWindowData_X11 *) window_data->specific;
    GLenum format = BGRA;

#endif

    float           x, y, w, h;

    x = (float) window_data->dst_offset_x;
    y = (float) window_data->dst_offset_y;
    w = (float) window_data->dst_offset_x + window_data->dst_width;
    h = (float) window_data->dst_offset_y + window_data->dst_height;

    float vertices[] = {
        x, y,
        0, 0, 

        w, y,
        1, 0,
        
        x, h,
        0, 1,

        w, h,
        1, 1,
    };

    glClear(GL_COLOR_BUFFER_BIT);

    UseCleanUp(glBindTexture(GL_TEXTURE_2D, window_data_ex->text_id));
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, window_data->buffer_width, window_data->buffer_height, 0, format, GL_UNSIGNED_BYTE, pixels);
    //glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, window_data->buffer_width, window_data->buffer_height, GL_RGBA, GL_UNSIGNED_BYTE, pixels);

    UseCleanUp(glEnableClientState(GL_VERTEX_ARRAY));
    UseCleanUp(glEnableClientState(GL_TEXTURE_COORD_ARRAY));
    glVertexPointer(2, GL_FLOAT, 4 * sizeof(float), vertices);
    glTexCoordPointer(2, GL_FLOAT, 4 * sizeof(float), vertices + 2);

    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    UseCleanUp(glDisableClientState(GL_TEXTURE_COORD_ARRAY));
    UseCleanUp(glDisableClientState(GL_VERTEX_ARRAY));
    UseCleanUp(glBindTexture(GL_TEXTURE_2D, 0));

#if defined(_WIN32) || defined(WIN32)
    SwapBuffers(window_data_ex->hdc);
#elif defined(linux)
    glXSwapBuffers(window_data_ex->display, window_data_ex->window);
#endif
}